

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_upgrade_tls(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  ulong in_RAX;
  byte bVar4;
  _Bool ssldone;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  _Var2 = Curl_conn_is_ssl(conn,0);
  if ((!_Var2) && (CVar3 = Curl_ssl_cfilter_add(data,conn,0), CVar3 != CURLE_OK)) {
    return CVar3;
  }
  CVar3 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_18 + 7));
  if (CVar3 == CURLE_OK) {
    bVar4 = *(byte *)((long)&conn->proto + 0xfb) & 0xfe | uStack_18._7_1_;
    *(byte *)((long)&conn->proto + 0xfb) = bVar4;
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      (data->conn->proto).imapc.state = IMAP_UPGRADETLS;
      bVar4 = *(byte *)((long)&conn->proto + 0xfb);
    }
    CVar3 = CURLE_OK;
    if ((bVar4 & 1) != 0) {
      conn->handler = &Curl_handler_imaps;
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 8;
      CVar3 = imap_perform_capability(data,conn);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct Curl_easy *data,
                                         struct connectdata *conn)
{
  /* Start the SSL connection */
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
  if(!result) {
    imapc->ssldone = ssldone;
    if(imapc->state != IMAP_UPGRADETLS)
      imap_state(data, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(data, conn);
    }
  }
out:
  return result;
}